

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddTable.c
# Opt level: O1

DdManager * cuddInitTable(uint numVars,uint numVarsZ,uint numSlots,uint looseUpTo)

{
  size_t sVar1;
  void *pvVar2;
  uint value;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  DdManager *__ptr;
  DdSubtable *pDVar7;
  DdSubtable *pDVar8;
  int *__ptr_00;
  int *__ptr_01;
  int *__ptr_02;
  int *__ptr_03;
  DdNode **ppDVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  uint *puVar13;
  long lVar14;
  
  __ptr = (DdManager *)malloc(0x2f8);
  if (__ptr != (DdManager *)0x0) {
    (__ptr->sentinel).type.value = 0.0;
    (__ptr->sentinel).type.kids.E = (DdNode *)0x0;
    (__ptr->sentinel).index = 0;
    (__ptr->sentinel).ref = 0;
    (__ptr->sentinel).next = (DdNode *)0x0;
    __ptr->epsilon = 1e-12;
    __ptr->maxGrowth = 1.1;
    __ptr->maxGrowthAlt = 2.2;
    __ptr->reordCycle = 0;
    __ptr->size = numVars;
    __ptr->sizeZ = numVarsZ;
    uVar4 = 10;
    if (10 < numVars) {
      uVar4 = numVars;
    }
    __ptr->maxSize = uVar4;
    uVar4 = 10;
    if (10 < numVarsZ) {
      uVar4 = numVarsZ;
    }
    __ptr->maxSizeZ = uVar4;
    uVar4 = 8;
    do {
      value = uVar4;
      uVar4 = value * 2;
    } while (value < numSlots);
    __ptr->initSlots = value;
    iVar3 = cuddComputeFloorLog2(value);
    uVar4 = (numVarsZ + numVars + 1) * value;
    __ptr->slots = uVar4;
    __ptr->keys = 0;
    __ptr->keysZ = 0;
    __ptr->dead = 0;
    __ptr->deadZ = 0;
    __ptr->maxLive = 0xffffffff;
    __ptr->gcFrac = 4.0;
    __ptr->minDead = uVar4 * 4;
    __ptr->looseUpTo = looseUpTo;
    __ptr->gcEnabled = 1;
    __ptr->allocated = 0;
    __ptr->reclaimed = 0.0;
    iVar5 = __ptr->maxSize;
    pDVar7 = (DdSubtable *)malloc((long)iVar5 * 0x38);
    __ptr->subtables = pDVar7;
    if (pDVar7 != (DdSubtable *)0x0) {
      iVar6 = __ptr->maxSizeZ;
      pDVar8 = (DdSubtable *)malloc((long)iVar6 * 0x38);
      __ptr->subtableZ = pDVar8;
      if (pDVar8 == (DdSubtable *)0x0) {
        free(pDVar7);
        __ptr->subtables = (DdSubtable *)0x0;
      }
      else {
        sVar1 = (long)iVar5 * 4;
        __ptr_00 = (int *)malloc(sVar1);
        __ptr->perm = __ptr_00;
        if (__ptr_00 == (int *)0x0) {
          free(pDVar7);
          __ptr->subtables = (DdSubtable *)0x0;
          free(pDVar8);
          __ptr->subtableZ = (DdSubtable *)0x0;
        }
        else {
          __ptr_01 = (int *)malloc(sVar1);
          __ptr->invperm = __ptr_01;
          if (__ptr_01 == (int *)0x0) {
            free(pDVar7);
            __ptr->subtables = (DdSubtable *)0x0;
            free(pDVar8);
            __ptr->subtableZ = (DdSubtable *)0x0;
            free(__ptr_00);
            __ptr->perm = (int *)0x0;
          }
          else {
            sVar1 = (long)iVar6 * 4;
            __ptr_02 = (int *)malloc(sVar1);
            __ptr->permZ = __ptr_02;
            if (__ptr_02 == (int *)0x0) {
              free(pDVar7);
              __ptr->subtables = (DdSubtable *)0x0;
              free(pDVar8);
              __ptr->subtableZ = (DdSubtable *)0x0;
              free(__ptr_00);
              __ptr->perm = (int *)0x0;
              free(__ptr_01);
              __ptr->invperm = (int *)0x0;
            }
            else {
              __ptr_03 = (int *)malloc(sVar1);
              __ptr->invpermZ = __ptr_03;
              if (__ptr_03 == (int *)0x0) {
                free(pDVar7);
                __ptr->subtables = (DdSubtable *)0x0;
                free(pDVar8);
                __ptr->subtableZ = (DdSubtable *)0x0;
                free(__ptr_00);
                __ptr->perm = (int *)0x0;
                free(__ptr_01);
                __ptr->invperm = (int *)0x0;
                free(__ptr_02);
                __ptr->permZ = (int *)0x0;
              }
              else {
                __ptr->map = (int *)0x0;
                if (iVar5 < iVar6) {
                  iVar5 = iVar6;
                }
                ppDVar9 = (DdNode **)malloc((long)iVar5 * 8 + 8);
                __ptr->stack = ppDVar9;
                if (ppDVar9 == (DdNode **)0x0) {
                  free(pDVar7);
                  __ptr->subtables = (DdSubtable *)0x0;
                  free(pDVar8);
                  __ptr->subtableZ = (DdSubtable *)0x0;
                  free(__ptr_00);
                  __ptr->perm = (int *)0x0;
                  free(__ptr_01);
                  __ptr->invperm = (int *)0x0;
                  free(__ptr_02);
                  __ptr->permZ = (int *)0x0;
                  free(__ptr_03);
                  __ptr->invpermZ = (int *)0x0;
                }
                else {
                  *ppDVar9 = (DdNode *)0x0;
                  iVar5 = cuddComputeFloorLog2(looseUpTo >> 2);
                  uVar4 = 1 << ((byte)iVar5 & 0x1f);
                  __ptr->deathRowDepth = uVar4;
                  ppDVar9 = (DdNode **)malloc((long)(int)uVar4 << 3);
                  __ptr->deathRow = ppDVar9;
                  if (ppDVar9 == (DdNode **)0x0) {
LAB_007f39a3:
                    if (__ptr->subtables != (DdSubtable *)0x0) {
                      free(__ptr->subtables);
                      __ptr->subtables = (DdSubtable *)0x0;
                    }
                  }
                  else {
                    if (iVar5 != 0x1f) {
                      uVar10 = 1;
                      if (1 < (int)uVar4) {
                        uVar10 = (ulong)uVar4;
                      }
                      uVar11 = 0;
                      do {
                        __ptr->deathRow[uVar11] = (DdNode *)0x0;
                        uVar11 = uVar11 + 1;
                      } while (uVar10 != uVar11);
                    }
                    iVar3 = 0x20 - iVar3;
                    __ptr->nextDead = 0;
                    __ptr->deadMask = uVar4 - 1;
                    uVar10 = (ulong)value;
                    if (numVars != 0) {
                      pDVar7 = __ptr->subtables;
                      uVar11 = 0;
                      do {
                        pDVar7[uVar11].slots = value;
                        pDVar7[uVar11].shift = iVar3;
                        pDVar7[uVar11].keys = 0;
                        pDVar7[uVar11].dead = 0;
                        pDVar7[uVar11].maxKeys = value * 4;
                        ppDVar9 = (DdNode **)malloc(uVar10 * 8);
                        pDVar8 = pDVar7 + uVar11;
                        pDVar8->bindVar = 0;
                        pDVar8->varType = CUDD_VAR_PRIMARY_INPUT;
                        *(undefined8 *)(&pDVar8->bindVar + 2) = 0;
                        pDVar7[uVar11].varToBeGrouped = CUDD_LAZY_NONE;
                        pDVar7[uVar11].nodelist = ppDVar9;
                        if (ppDVar9 == (DdNode **)0x0) {
                          if (uVar11 != 0) {
                            lVar14 = 0;
                            do {
                              pvVar2 = *(void **)((long)&__ptr->subtables->nodelist + lVar14);
                              if (pvVar2 != (void *)0x0) {
                                free(pvVar2);
                                *(undefined8 *)((long)&__ptr->subtables->nodelist + lVar14) = 0;
                              }
                              lVar14 = lVar14 + 0x38;
                              uVar11 = uVar11 - 1;
                            } while (uVar11 != 0);
                          }
                          goto LAB_007f39a3;
                        }
                        if (value != 0) {
                          uVar12 = 0;
                          do {
                            ppDVar9[uVar12] = (DdNode *)__ptr;
                            uVar12 = uVar12 + 1;
                          } while (uVar10 != uVar12);
                        }
                        __ptr->perm[uVar11] = (int)uVar11;
                        __ptr->invperm[uVar11] = (int)uVar11;
                        uVar11 = uVar11 + 1;
                      } while (uVar11 != numVars);
                    }
                    if (numVarsZ != 0) {
                      puVar13 = &__ptr->subtableZ->dead;
                      uVar11 = 0;
LAB_007f35fa:
                      puVar13[-3] = value;
                      puVar13[-4] = iVar3;
                      puVar13[-2] = 0;
                      *puVar13 = 0;
                      puVar13[-1] = value * 4;
                      ppDVar9 = (DdNode **)malloc(uVar10 * 8);
                      ((DdSubtable *)(puVar13 + -6))->nodelist = ppDVar9;
                      if (ppDVar9 != (DdNode **)0x0) goto code_r0x007f362b;
                      if (numVars != 0) {
                        lVar14 = 0;
                        do {
                          pvVar2 = *(void **)((long)&__ptr->subtables->nodelist + lVar14);
                          if (pvVar2 != (void *)0x0) {
                            free(pvVar2);
                            *(undefined8 *)((long)&__ptr->subtables->nodelist + lVar14) = 0;
                          }
                          lVar14 = lVar14 + 0x38;
                        } while ((ulong)numVars * 0x38 - lVar14 != 0);
                      }
                      if (__ptr->subtables != (DdSubtable *)0x0) {
                        free(__ptr->subtables);
                        __ptr->subtables = (DdSubtable *)0x0;
                      }
                      if (uVar11 != 0) {
                        lVar14 = 0;
                        do {
                          pvVar2 = *(void **)((long)&__ptr->subtableZ->nodelist + lVar14);
                          if (pvVar2 != (void *)0x0) {
                            free(pvVar2);
                            *(undefined8 *)((long)&__ptr->subtableZ->nodelist + lVar14) = 0;
                          }
                          lVar14 = lVar14 + 0x38;
                          uVar11 = uVar11 - 1;
                        } while (uVar11 != 0);
                      }
                      goto LAB_007f39bf;
                    }
LAB_007f365f:
                    (__ptr->constants).slots = value;
                    (__ptr->constants).shift = iVar3;
                    (__ptr->constants).keys = 0;
                    (__ptr->constants).dead = 0;
                    (__ptr->constants).maxKeys = value * 4;
                    ppDVar9 = (DdNode **)malloc(uVar10 * 8);
                    (__ptr->constants).nodelist = ppDVar9;
                    if (ppDVar9 != (DdNode **)0x0) {
                      if (value != 0) {
                        memset(ppDVar9,0,uVar10 << 3);
                      }
                      __ptr->memoryList = (DdNode **)0x0;
                      __ptr->nextFree = (DdNode *)0x0;
                      iVar3 = __ptr->maxSize;
                      iVar5 = __ptr->maxSizeZ;
                      iVar6 = iVar3;
                      if (iVar3 < iVar5) {
                        iVar6 = iVar5;
                      }
                      __ptr->memused =
                           (long)(iVar5 + iVar3) * 0x40 + (ulong)(value * (numVars + 1)) * 8 +
                           (long)iVar6 * 8 + (long)__ptr->deathRowDepth * 8 + 0x300;
                      __ptr->autoDyn = 0;
                      __ptr->autoDynZ = 0;
                      __ptr->realign = 0;
                      __ptr->realignZ = 0;
                      __ptr->reordered = 0;
                      __ptr->reorderings = 0;
                      __ptr->autoMethod = CUDD_REORDER_SIFT;
                      __ptr->autoMethodZ = CUDD_REORDER_SIFT;
                      __ptr->nextDyn = 0xfa4;
                      __ptr->countDead = 0xffffffff;
                      __ptr->siftMaxVar = 1000;
                      __ptr->siftMaxSwap = 2000000;
                      __ptr->tree = (MtrNode *)0x0;
                      __ptr->treeZ = (MtrNode *)0x0;
                      __ptr->groupcheck = CUDD_GROUP_CHECK7;
                      __ptr->linear = (long *)0x0;
                      __ptr->linearSize = 0;
                      __ptr->univ = (DdNode **)0x0;
                      __ptr->populationSize = 0;
                      __ptr->numberXovers = 0;
                      __ptr->localCaches = (DdLocalCache *)0x0;
                      __ptr->recomb = 0;
                      __ptr->symmviolation = 0;
                      __ptr->arcviolation = 0;
                      __ptr->populationSize = 0;
                      __ptr->preReorderingHook = (DdHook *)0x0;
                      __ptr->postReorderingHook = (DdHook *)0x0;
                      __ptr->preGCHook = (DdHook *)0x0;
                      __ptr->postGCHook = (DdHook *)0x0;
                      __ptr->out = _stdout;
                      __ptr->err = _stderr;
                      __ptr->errorCode = CUDD_NO_ERROR;
                      __ptr->maxmemhard = 0xffffffffffffffff;
                      __ptr->garbageCollections = 0;
                      __ptr->peakLiveNodes = 0;
                      __ptr->GCTime = 0;
                      __ptr->reordTime = 0;
                      return __ptr;
                    }
                    if (numVars != 0) {
                      lVar14 = 0;
                      do {
                        pvVar2 = *(void **)((long)&__ptr->subtables->nodelist + lVar14);
                        if (pvVar2 != (void *)0x0) {
                          free(pvVar2);
                          *(undefined8 *)((long)&__ptr->subtables->nodelist + lVar14) = 0;
                        }
                        lVar14 = lVar14 + 0x38;
                      } while ((ulong)numVars * 0x38 - lVar14 != 0);
                    }
                    if (__ptr->subtables != (DdSubtable *)0x0) {
                      free(__ptr->subtables);
                      __ptr->subtables = (DdSubtable *)0x0;
                    }
                    if (numVarsZ != 0) {
                      lVar14 = 0;
                      do {
                        pvVar2 = *(void **)((long)&__ptr->subtableZ->nodelist + lVar14);
                        if (pvVar2 != (void *)0x0) {
                          free(pvVar2);
                          *(undefined8 *)((long)&__ptr->subtableZ->nodelist + lVar14) = 0;
                        }
                        lVar14 = lVar14 + 0x38;
                      } while ((ulong)numVarsZ * 0x38 - lVar14 != 0);
                    }
                  }
LAB_007f39bf:
                  if (__ptr->subtableZ != (DdSubtable *)0x0) {
                    free(__ptr->subtableZ);
                    __ptr->subtableZ = (DdSubtable *)0x0;
                  }
                  if (__ptr->perm != (int *)0x0) {
                    free(__ptr->perm);
                    __ptr->perm = (int *)0x0;
                  }
                  if (__ptr->invperm != (int *)0x0) {
                    free(__ptr->invperm);
                    __ptr->invperm = (int *)0x0;
                  }
                  if (__ptr->permZ != (int *)0x0) {
                    free(__ptr->permZ);
                    __ptr->permZ = (int *)0x0;
                  }
                  if (__ptr->invpermZ != (int *)0x0) {
                    free(__ptr->invpermZ);
                    __ptr->invpermZ = (int *)0x0;
                  }
                  if (__ptr->stack != (DdNode **)0x0) {
                    free(__ptr->stack);
                    __ptr->stack = (DdNode **)0x0;
                  }
                }
              }
            }
          }
        }
      }
    }
    free(__ptr);
  }
  return (DdManager *)0x0;
code_r0x007f362b:
  if (value != 0) {
    memset(ppDVar9,0,uVar10 * 8);
  }
  __ptr->permZ[uVar11] = (int)uVar11;
  __ptr->invpermZ[uVar11] = (int)uVar11;
  uVar11 = uVar11 + 1;
  puVar13 = puVar13 + 0xe;
  if (numVarsZ == uVar11) goto LAB_007f365f;
  goto LAB_007f35fa;
}

Assistant:

DdManager *
cuddInitTable(
  unsigned int numVars  /* Initial number of BDD variables (and subtables) */,
  unsigned int numVarsZ /* Initial number of ZDD variables (and subtables) */,
  unsigned int numSlots /* Initial size of the BDD subtables */,
  unsigned int looseUpTo /* Limit for fast table growth */)
{
    DdManager   *unique = ABC_ALLOC(DdManager,1);
    int         i, j;
    DdNodePtr   *nodelist;
    DdNode      *sentinel;
    unsigned int slots;
    int shift;

    if (unique == NULL) {
        return(NULL);
    }
    sentinel = &(unique->sentinel);
    sentinel->ref = 0;
    sentinel->index = 0;
    cuddT(sentinel) = NULL;
    cuddE(sentinel) = NULL;
    sentinel->next = NULL;
    unique->epsilon = DD_EPSILON;
    unique->maxGrowth = DD_MAX_REORDER_GROWTH;
    unique->maxGrowthAlt = 2.0 * DD_MAX_REORDER_GROWTH;
    unique->reordCycle = 0;     /* do not use alternate threshold */
    unique->size = numVars;
    unique->sizeZ = numVarsZ;
    unique->maxSize = ddMax(DD_DEFAULT_RESIZE, numVars);
    unique->maxSizeZ = ddMax(DD_DEFAULT_RESIZE, numVarsZ);

    /* Adjust the requested number of slots to a power of 2. */
    slots = 8;
    while (slots < numSlots) {
        slots <<= 1;
    }
    unique->initSlots = slots;
    shift = sizeof(int) * 8 - cuddComputeFloorLog2(slots);

    unique->slots = (numVars + numVarsZ + 1) * slots;
    unique->keys = 0;
    unique->maxLive = ~0;       /* very large number */
    unique->keysZ = 0;
    unique->dead = 0;
    unique->deadZ = 0;
    unique->gcFrac = DD_GC_FRAC_HI;
    unique->minDead = (unsigned) (DD_GC_FRAC_HI * (double) unique->slots);
    unique->looseUpTo = looseUpTo;
    unique->gcEnabled = 1;
    unique->allocated = 0;
    unique->reclaimed = 0;
    unique->subtables = ABC_ALLOC(DdSubtable,unique->maxSize);
    if (unique->subtables == NULL) {
        ABC_FREE(unique);
        return(NULL);
    }
    unique->subtableZ = ABC_ALLOC(DdSubtable,unique->maxSizeZ);
    if (unique->subtableZ == NULL) {
        ABC_FREE(unique->subtables);
        ABC_FREE(unique);
        return(NULL);
    }
    unique->perm = ABC_ALLOC(int,unique->maxSize);
    if (unique->perm == NULL) {
        ABC_FREE(unique->subtables);
        ABC_FREE(unique->subtableZ);
        ABC_FREE(unique);
        return(NULL);
    }
    unique->invperm = ABC_ALLOC(int,unique->maxSize);
    if (unique->invperm == NULL) {
        ABC_FREE(unique->subtables);
        ABC_FREE(unique->subtableZ);
        ABC_FREE(unique->perm);
        ABC_FREE(unique);
        return(NULL);
    }
    unique->permZ = ABC_ALLOC(int,unique->maxSizeZ);
    if (unique->permZ == NULL) {
        ABC_FREE(unique->subtables);
        ABC_FREE(unique->subtableZ);
        ABC_FREE(unique->perm);
        ABC_FREE(unique->invperm);
        ABC_FREE(unique);
        return(NULL);
    }
    unique->invpermZ = ABC_ALLOC(int,unique->maxSizeZ);
    if (unique->invpermZ == NULL) {
        ABC_FREE(unique->subtables);
        ABC_FREE(unique->subtableZ);
        ABC_FREE(unique->perm);
        ABC_FREE(unique->invperm);
        ABC_FREE(unique->permZ);
        ABC_FREE(unique);
        return(NULL);
    }
    unique->map = NULL;
    unique->stack = ABC_ALLOC(DdNodePtr,ddMax(unique->maxSize,unique->maxSizeZ)+1);
    if (unique->stack == NULL) {
        ABC_FREE(unique->subtables);
        ABC_FREE(unique->subtableZ);
        ABC_FREE(unique->perm);
        ABC_FREE(unique->invperm);
        ABC_FREE(unique->permZ);
        ABC_FREE(unique->invpermZ);
        ABC_FREE(unique);
        return(NULL);
    }
    unique->stack[0] = NULL; /* to suppress harmless UMR */

#ifndef DD_NO_DEATH_ROW
    unique->deathRowDepth = 1 << cuddComputeFloorLog2(unique->looseUpTo >> 2);
    unique->deathRow = ABC_ALLOC(DdNodePtr,unique->deathRowDepth);
    if (unique->deathRow == NULL) {
        ABC_FREE(unique->subtables);
        ABC_FREE(unique->subtableZ);
        ABC_FREE(unique->perm);
        ABC_FREE(unique->invperm);
        ABC_FREE(unique->permZ);
        ABC_FREE(unique->invpermZ);
        ABC_FREE(unique->stack);
        ABC_FREE(unique);
        return(NULL);
    }
    for (i = 0; i < unique->deathRowDepth; i++) {
        unique->deathRow[i] = NULL;
    }
    unique->nextDead = 0;
    unique->deadMask = unique->deathRowDepth - 1;
#endif

    for (i = 0; (unsigned) i < numVars; i++) {
        unique->subtables[i].slots = slots;
        unique->subtables[i].shift = shift;
        unique->subtables[i].keys = 0;
        unique->subtables[i].dead = 0;
        unique->subtables[i].maxKeys = slots * DD_MAX_SUBTABLE_DENSITY;
        unique->subtables[i].bindVar = 0;
        unique->subtables[i].varType = CUDD_VAR_PRIMARY_INPUT;
        unique->subtables[i].pairIndex = 0;
        unique->subtables[i].varHandled = 0;
        unique->subtables[i].varToBeGrouped = CUDD_LAZY_NONE;

        nodelist = unique->subtables[i].nodelist = ABC_ALLOC(DdNodePtr,slots);
        if (nodelist == NULL) {
            for (j = 0; j < i; j++) {
                ABC_FREE(unique->subtables[j].nodelist);
            }
            ABC_FREE(unique->subtables);
            ABC_FREE(unique->subtableZ);
            ABC_FREE(unique->perm);
            ABC_FREE(unique->invperm);
            ABC_FREE(unique->permZ);
            ABC_FREE(unique->invpermZ);
            ABC_FREE(unique->stack);
            ABC_FREE(unique);
            return(NULL);
        }
        for (j = 0; (unsigned) j < slots; j++) {
            nodelist[j] = sentinel;
        }
        unique->perm[i] = i;
        unique->invperm[i] = i;
    }
    for (i = 0; (unsigned) i < numVarsZ; i++) {
        unique->subtableZ[i].slots = slots;
        unique->subtableZ[i].shift = shift;
        unique->subtableZ[i].keys = 0;
        unique->subtableZ[i].dead = 0;
        unique->subtableZ[i].maxKeys = slots * DD_MAX_SUBTABLE_DENSITY;
        nodelist = unique->subtableZ[i].nodelist = ABC_ALLOC(DdNodePtr,slots);
        if (nodelist == NULL) {
            for (j = 0; (unsigned) j < numVars; j++) {
                ABC_FREE(unique->subtables[j].nodelist);
            }
            ABC_FREE(unique->subtables);
            for (j = 0; j < i; j++) {
                ABC_FREE(unique->subtableZ[j].nodelist);
            }
            ABC_FREE(unique->subtableZ);
            ABC_FREE(unique->perm);
            ABC_FREE(unique->invperm);
            ABC_FREE(unique->permZ);
            ABC_FREE(unique->invpermZ);
            ABC_FREE(unique->stack);
            ABC_FREE(unique);
            return(NULL);
        }
        for (j = 0; (unsigned) j < slots; j++) {
            nodelist[j] = NULL;
        }
        unique->permZ[i] = i;
        unique->invpermZ[i] = i;
    }
    unique->constants.slots = slots;
    unique->constants.shift = shift;
    unique->constants.keys = 0;
    unique->constants.dead = 0;
    unique->constants.maxKeys = slots * DD_MAX_SUBTABLE_DENSITY;
    nodelist = unique->constants.nodelist = ABC_ALLOC(DdNodePtr,slots);
    if (nodelist == NULL) {
        for (j = 0; (unsigned) j < numVars; j++) {
            ABC_FREE(unique->subtables[j].nodelist);
        }
        ABC_FREE(unique->subtables);
        for (j = 0; (unsigned) j < numVarsZ; j++) {
            ABC_FREE(unique->subtableZ[j].nodelist);
        }
        ABC_FREE(unique->subtableZ);
        ABC_FREE(unique->perm);
        ABC_FREE(unique->invperm);
        ABC_FREE(unique->permZ);
        ABC_FREE(unique->invpermZ);
        ABC_FREE(unique->stack);
        ABC_FREE(unique);
        return(NULL);
    }
    for (j = 0; (unsigned) j < slots; j++) {
        nodelist[j] = NULL;
    }

    unique->memoryList = NULL;
    unique->nextFree = NULL;

    unique->memused = sizeof(DdManager) + (unique->maxSize + unique->maxSizeZ)
        * (sizeof(DdSubtable) + 2 * sizeof(int)) + (numVars + 1) *
        slots * sizeof(DdNodePtr) +
        (ddMax(unique->maxSize,unique->maxSizeZ) + 1) * sizeof(DdNodePtr);
#ifndef DD_NO_DEATH_ROW
    unique->memused += unique->deathRowDepth * sizeof(DdNodePtr);
#endif

    /* Initialize fields concerned with automatic dynamic reordering */
    unique->reorderings = 0;
    unique->autoDyn = 0;        /* initially disabled */
    unique->autoDynZ = 0;       /* initially disabled */
    unique->realign = 0;        /* initially disabled */
    unique->realignZ = 0;       /* initially disabled */
    unique->reordered = 0;
    unique->autoMethod = CUDD_REORDER_SIFT;
    unique->autoMethodZ = CUDD_REORDER_SIFT;
    unique->nextDyn = DD_FIRST_REORDER;
    unique->countDead = ~0;
    unique->siftMaxVar = DD_SIFT_MAX_VAR;
    unique->siftMaxSwap = DD_SIFT_MAX_SWAPS;
    unique->tree = NULL;
    unique->treeZ = NULL;
    unique->groupcheck = CUDD_GROUP_CHECK7;
    unique->recomb = DD_DEFAULT_RECOMB;
    unique->symmviolation = 0;
    unique->arcviolation = 0;
    unique->populationSize = 0;
    unique->numberXovers = 0;
    unique->linear = NULL;
    unique->linearSize = 0;

    /* Initialize ZDD universe. */
    unique->univ = (DdNodePtr *)NULL;

    /* Initialize auxiliary fields. */
    unique->localCaches = NULL;
    unique->preGCHook = NULL;
    unique->postGCHook = NULL;
    unique->preReorderingHook = NULL;
    unique->postReorderingHook = NULL;
    unique->out = stdout;
    unique->err = stderr;
    unique->errorCode = CUDD_NO_ERROR;

    /* Initialize statistical counters. */
    unique->maxmemhard = ~ 0UL;
    unique->garbageCollections = 0;
    unique->GCTime = 0;
    unique->reordTime = 0;
#ifdef DD_STATS
    unique->nodesDropped = 0;
    unique->nodesFreed = 0;
#endif
    unique->peakLiveNodes = 0;
#ifdef DD_UNIQUE_PROFILE
    unique->uniqueLookUps = 0;
    unique->uniqueLinks = 0;
#endif
#ifdef DD_COUNT
    unique->recursiveCalls = 0;
    unique->swapSteps = 0;
#ifdef DD_STATS
    unique->nextSample = 250000;
#endif
#endif

    return(unique);

}